

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O0

void __thiscall jsonnet::internal::RuntimeError::~RuntimeError(RuntimeError *this)

{
  long in_RDI;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(unaff_retaddr);
  return;
}

Assistant:

RuntimeError(const std::vector<TraceFrame> stack_trace, const std::string &msg)
        : stackTrace(stack_trace), msg(msg)
    {
    }